

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

bool __thiscall
slang::ast::Expression::bindMembershipExpressions
          (Expression *this,ASTContext *context,TokenKind keyword,bool requireIntegral,
          bool unwrapUnpacked,bool allowTypeReferences,bool allowValueRange,
          ExpressionSyntax *valueExpr,
          span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions,
          SmallVectorBase<const_slang::ast::Expression_*> *results)

{
  Compilation *compilation;
  long lVar1;
  long lVar2;
  SourceRange opRange;
  SyntaxNode *pSVar3;
  undefined8 uVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Expression *expr;
  Diagnostic *pDVar9;
  Type *this_00;
  undefined7 in_register_00000009;
  undefined6 in_register_00000012;
  long lVar10;
  Symbol *expr_00;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  bitmask<slang::ast::ASTFlags> extraFlags;
  undefined7 in_stack_00000009;
  string_view keywordStr;
  optional<unsigned_int> valueWidth;
  anon_class_72_9_cf3fa5c1 checkType;
  unkbyte10 in_stack_ffffffffffffff3c;
  undefined1 local_b8 [28];
  undefined4 local_9c;
  int local_98;
  undefined4 local_94;
  string_view local_90;
  _Optional_payload_base<unsigned_int> local_80;
  anon_class_72_9_cf3fa5c1 local_78;
  
  local_9c = (undefined4)CONCAT71(in_register_00000089,allowTypeReferences);
  local_94 = (undefined4)CONCAT71(in_register_00000009,requireIntegral);
  local_b8._14_2_ = SUB82(context,0);
  local_90 = parsing::LexerFacts::getTokenKindText(local_b8._14_2_);
  extraFlags.m_bits._0_4_ = (int)CONCAT71(in_register_00000081,unwrapUnpacked) << 0xf;
  extraFlags.m_bits._4_4_ = 0;
  compilation = (Compilation *)**(undefined8 **)this;
  expr = create(compilation,(ExpressionSyntax *)CONCAT71(in_stack_00000009,allowValueRange),
                (ASTContext *)this,extraFlags,(Type *)0x0);
  local_78.type = (Type **)expr;
  SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
            ((SmallVectorBase<slang::ast::Expression_const*> *)expressions._M_extent._M_extent_value
             ,(Expression **)&local_78);
  local_b8._16_8_ = (expr->type).ptr;
  local_80 = (_Optional_payload_base<unsigned_int>)
             evalEffectiveWidth((ASTContext *)this,expr,local_b8._14_2_);
  bVar5 = bad(expr);
  bVar6 = isImplicitString(expr);
  local_98 = (int)CONCAT62(in_register_00000012,keyword);
  if (local_98 == 0) {
    bVar7 = Type::isAggregate((Type *)local_b8._16_8_);
    if (!bVar7) {
      if ((char)local_98 == '\0') goto LAB_0043ed49;
      goto LAB_0043ece2;
    }
  }
  else {
LAB_0043ece2:
    bVar7 = Type::isIntegral((Type *)local_b8._16_8_);
    if (bVar7) goto LAB_0043ed49;
  }
  if ((bool)bVar5 == false) {
    pDVar9 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x270007,expr->sourceRange);
    pDVar9 = ast::operator<<(pDVar9,(Type *)local_b8._16_8_);
    Diagnostic::operator<<(pDVar9,local_90);
    bVar5 = true;
  }
LAB_0043ed49:
  local_78.type = (Type **)(local_b8 + 0x10);
  local_78.canBeStrings = (bool *)&stack0xffffffffffffff47;
  local_78.keywordStr = &local_90;
  local_78.bad = (bool *)&stack0xffffffffffffff46;
  local_78.keyword = (TokenKind *)(local_b8 + 0xe);
  local_78.valueWidth = (optional<unsigned_int> *)&local_80;
  local_78.comp = compilation;
  local_78.context = (ASTContext *)this;
  local_78.valueRes = expr;
  if (expressions._M_ptr != (pointer)0x0) {
    pSVar3 = &valueExpr->super_SyntaxNode;
    do {
      local_b8._0_8_ =
           create(compilation,*(ExpressionSyntax **)valueExpr,(ASTContext *)this,extraFlags,
                  (Type *)0x0);
      SmallVectorBase<slang::ast::Expression_const*>::
      emplace_back<slang::ast::Expression_const*const&>
                ((SmallVectorBase<slang::ast::Expression_const*> *)
                 expressions._M_extent._M_extent_value,(Expression **)local_b8);
      bVar7 = bad((Expression *)local_b8._0_8_);
      bVar5 = bVar7 | bVar5;
      if (bVar5 == 0) {
        if (((byte)local_9c == '\0') ||
           (*(ExpressionKind *)(Compilation **)local_b8._0_8_ != ValueRange)) {
          this_00 = (Type *)((string_view *)(local_b8._0_8_ + 8))->_M_len;
          if ((char)local_98 == '\0') {
            if ((char)local_94 != '\0') {
              while (bVar7 = Type::isUnpackedArray(this_00), bVar7) {
                this_00 = Type::getArrayElementType(this_00);
              }
            }
            expr_00 = (Symbol *)local_b8._0_8_;
            if ((bVar6 == true) &&
               (bVar7 = isImplicitString((Expression *)local_b8._0_8_),
               expr_00 = (Symbol *)local_b8._0_8_, !bVar7)) {
              if (this_00->canonical == (Type *)0x0) {
                Type::resolveCanonical(this_00);
              }
              expr_00 = (Symbol *)local_b8._0_8_;
              if ((this_00->canonical->super_Symbol).kind != StringType) {
                bVar6 = false;
              }
            }
          }
          else {
            bVar7 = Type::isIntegral(this_00);
            expr_00 = (Symbol *)local_b8._0_8_;
            if (!bVar7) {
              pDVar9 = ASTContext::addDiag((ASTContext *)this,(DiagCode)0x270007,
                                           *(SourceRange *)(local_b8._0_8_ + 0x20));
              pDVar9 = ast::operator<<(pDVar9,this_00);
              Diagnostic::operator<<(pDVar9,local_90);
              bVar5 = true;
              goto LAB_0043ef1a;
            }
          }
        }
        else {
          if ((bVar6 == true) && (bVar7 = isImplicitString((Expression *)local_b8._0_8_), !bVar7)) {
            bVar6 = false;
          }
          uVar4 = local_b8._0_8_;
          bindMembershipExpressions::anon_class_72_9_cf3fa5c1::operator()
                    (&local_78,(Expression *)((Scope *)(local_b8._0_8_ + 0x38))->compilation,
                     (Type *)(((Symbol *)
                              &((Scope *)(local_b8._0_8_ + 0x38))->compilation->super_BumpAllocator)
                             ->name)._M_len);
          if (*(int *)(uVar4 + 0x30) != 0) goto LAB_0043ef1a;
          expr_00 = ((Scope *)(uVar4 + 0x38))->thisSym;
          this_00 = (Type *)(expr_00->name)._M_len;
        }
        bindMembershipExpressions::anon_class_72_9_cf3fa5c1::operator()
                  (&local_78,(Expression *)expr_00,this_00);
      }
LAB_0043ef1a:
      valueExpr = (ExpressionSyntax *)((long)valueExpr + 8);
    } while (valueExpr != (ExpressionSyntax *)(&pSVar3->kind + (long)expressions._M_ptr * 2));
  }
  local_9c = CONCAT31(local_9c._1_3_,bVar5);
  if (((bool)bVar5 == false) &&
     (lVar1 = *(long *)(expressions._M_extent._M_extent_value + 8), lVar1 != 0)) {
    lVar2 = *(long *)expressions._M_extent._M_extent_value;
    lVar10 = 0;
    bVar7 = false;
    do {
      local_b8._0_8_ = *(long *)(lVar2 + lVar10);
      bVar8 = Type::isNumeric((Type *)local_b8._16_8_);
      uVar4 = local_b8._16_8_;
      if (bVar8) {
LAB_0043ef91:
        bVar8 = Type::isUnpackedArray
                          (((not_null<const_slang::ast::Type_*> *)(local_b8._0_8_ + 8))->ptr);
        if (bVar8) goto LAB_0043efa3;
        opRange._4_10_ = in_stack_ffffffffffffff3c;
        opRange.startLoc._0_4_ = 1;
        opRange.endLoc._6_1_ = bVar7;
        opRange.endLoc._7_1_ = bVar6;
        contextDetermined(this,(ASTContext *)local_b8,(Expression **)0x0,
                          (Expression *)local_b8._16_8_,(Type *)0x0,opRange,Implicit);
      }
      else {
        if (*(Type **)(local_b8._16_8_ + 0x40) == (Type *)0x0) {
          Type::resolveCanonical((Type *)local_b8._16_8_);
        }
        if (((*(Type **)(uVar4 + 0x40))->super_Symbol).kind == StringType) goto LAB_0043ef91;
LAB_0043efa3:
        selfDetermined((ASTContext *)this,(Expression **)local_b8);
      }
      *(undefined8 *)(*(long *)expressions._M_extent._M_extent_value + lVar10) = local_b8._0_8_;
      lVar10 = lVar10 + 8;
    } while (lVar1 << 3 != lVar10);
  }
  return (bool)((byte)local_9c ^ 1);
}

Assistant:

bool Expression::bindMembershipExpressions(const ASTContext& context, TokenKind keyword,
                                           bool requireIntegral, bool unwrapUnpacked,
                                           bool allowTypeReferences, bool allowValueRange,
                                           const ExpressionSyntax& valueExpr,
                                           std::span<const ExpressionSyntax* const> expressions,
                                           SmallVectorBase<const Expression*>& results) {
    const auto keywordStr = LexerFacts::getTokenKindText(keyword);
    auto extraFlags = allowTypeReferences ? ASTFlags::AllowTypeReferences : ASTFlags::None;
    Compilation& comp = context.getCompilation();
    Expression& valueRes = create(comp, valueExpr, context, extraFlags);
    results.push_back(&valueRes);

    const Type* type = valueRes.type;
    auto valueWidth = evalEffectiveWidth(context, valueRes, keyword);
    bool bad = valueRes.bad();
    bool canBeStrings = valueRes.isImplicitString();

    if ((!requireIntegral && type->isAggregate()) || (requireIntegral && !type->isIntegral())) {
        if (!bad) {
            context.addDiag(diag::BadSetMembershipType, valueRes.sourceRange)
                << *type << keywordStr;
            bad = true;
        }
    }

    auto checkType = [&](const Expression& expr, const Type& bt) {
        if (bt.isNumeric() && type->isNumeric()) {
            type = OpInfo::binaryType(comp, type, &bt, false);
        }
        else if ((bt.isClass() && bt.isAssignmentCompatible(*type)) ||
                 (type->isClass() && type->isAssignmentCompatible(bt))) {
            // ok
        }
        else if ((bt.isCHandle() || bt.isNull()) && (type->isCHandle() || type->isNull())) {
            // ok
        }
        else if ((bt.isEvent() || bt.isNull()) && (type->isEvent() || type->isNull())) {
            // ok
        }
        else if ((bt.isCovergroup() || bt.isNull()) && (type->isCovergroup() || type->isNull())) {
            // ok
        }
        else if (bt.isTypeRefType() && type->isTypeRefType()) {
            // ok
        }
        else if (bt.isUnbounded() && (type->isNumeric() || type->isString())) {
            // ok
        }
        else if (canBeStrings) {
            // If canBeStrings is still true, it means either this specific type or
            // the common type (or both) are of type string. This is ok, but force
            // all further expressions to also be strings (or implicitly
            // convertible to them).
            type = &comp.getStringType();
        }
        else if (bt.isAggregate()) {
            // Aggregates are just never allowed in membership expressions.
            context.addDiag(diag::BadSetMembershipType, expr.sourceRange) << bt << keywordStr;
            bad = true;
        }
        else {
            // Couldn't find a common type.
            context.addDiag(diag::NoCommonComparisonType, expr.sourceRange)
                << keywordStr << bt << *type;
            bad = true;
        }

        if (!bad && !bt.isMatching(*valueRes.type) && !bt.isUnbounded()) {
            auto& lct = bt.getCanonicalType();
            auto& rct = valueRes.type->getCanonicalType();
            BinaryExpression::analyzeOpTypes(lct, rct, bt, *valueRes.type, expr, valueRes, context,
                                             expr.sourceRange, diag::CaseTypeMismatch,
                                             /* isComparison */ false, keywordStr);

            if (expr.type->isIntegral() && valueRes.type->isIntegral()) {
                // Check whether either the item or the value expression is
                // a constant integral (but not both). If so, check that the
                // constant value's effective width is not larger than the
                // bit width of the other expression, which would make it
                // impossible to ever match.
                auto exprWidth = evalEffectiveWidth(context, expr, keyword);
                auto vw = valueWidth.value_or(valueRes.type->getBitWidth());

                if (valueWidth > expr.type->getBitWidth() && !exprWidth) {
                    auto& diag = context.addDiag(diag::CaseOutsideRange, expr.sourceRange);
                    diag << keywordStr << expr.type->getBitWidth() << *valueWidth;
                }
                else if (exprWidth > vw && !valueWidth) {
                    auto& diag = context.addDiag(diag::CaseOutsideRange, expr.sourceRange);
                    diag << keywordStr << *exprWidth << vw;
                }
            }
        }
    };

    // We need to find a common type across all expressions. If this is for a wildcard
    // case statement, the types can only be integral. Otherwise all singular types are allowed.
    for (auto expr : expressions) {
        Expression* bound = &create(comp, *expr, context, extraFlags);
        results.push_back(bound);
        bad |= bound->bad();
        if (bad)
            continue;

        // Special handling for value range expressions -- they don't have
        // a real type on their own, we need to check their bounds.
        if (allowValueRange && bound->kind == ExpressionKind::ValueRange) {
            if (canBeStrings && !bound->isImplicitString())
                canBeStrings = false;

            auto& range = bound->as<ValueRangeExpression>();
            checkType(range.left(), *range.left().type);
            if (range.rangeKind == ValueRangeKind::Simple)
                checkType(range.right(), *range.right().type);
            continue;
        }

        const Type* bt = bound->type;
        if (requireIntegral) {
            if (!bt->isIntegral()) {
                context.addDiag(diag::BadSetMembershipType, bound->sourceRange)
                    << *bt << keywordStr;
                bad = true;
            }
            else {
                checkType(*bound, *bt);
            }
            continue;
        }

        // If this is an "inside" operation, then unpacked arrays are unwrapped
        // into their element types before checking further.
        if (unwrapUnpacked) {
            while (bt->isUnpackedArray())
                bt = bt->getArrayElementType();
        }

        if (canBeStrings && !bound->isImplicitString() && !bt->isString())
            canBeStrings = false;

        checkType(*bound, *bt);
    }

    if (bad)
        return false;

    size_t index = 0;
    for (auto result : results) {
        // const_casts here are because we want the result array to be constant and
        // don't want to waste time / space allocating another array here locally just
        // to immediately copy it to the output.
        Expression* expr = const_cast<Expression*>(result);

        if ((type->isNumeric() || type->isString()) && !expr->type->isUnpackedArray())
            contextDetermined(context, expr, nullptr, *type, {});
        else
            selfDetermined(context, expr);

        SLANG_ASSERT(!expr->bad());
        results[index++] = expr;
    }

    return true;
}